

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawTranslatedColumnP_C(void)

{
  int iVar1;
  lighttable_t *plVar2;
  fixed_t fVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  int pitch;
  BYTE *source;
  BYTE *translation;
  BYTE *colormap;
  fixed_t fracstep;
  fixed_t frac;
  BYTE *dest;
  int count;
  
  pBVar5 = dc_translation;
  pBVar4 = dc_source;
  fVar3 = dc_iscale;
  plVar2 = dc_colormap;
  iVar1 = dc_pitch;
  dest._4_4_ = dc_count;
  if (0 < dc_count) {
    _fracstep = dc_dest;
    colormap._4_4_ = dc_texturefrac;
    do {
      *_fracstep = plVar2[pBVar5[pBVar4[colormap._4_4_ >> 0x10]]];
      _fracstep = _fracstep + iVar1;
      colormap._4_4_ = fVar3 + colormap._4_4_;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void R_DrawTranslatedColumnP_C (void)
{ 
	int 				count;
	BYTE*				dest;
	fixed_t 			frac;
	fixed_t 			fracstep;

	count = dc_count;
	if (count <= 0) 
		return;

	dest = dc_dest;

	fracstep = dc_iscale;
	frac = dc_texturefrac;

	{
		// [RH] Local copies of global vars to improve compiler optimizations
		BYTE *colormap = dc_colormap;
		BYTE *translation = dc_translation;
		const BYTE *source = dc_source;
		int pitch = dc_pitch;

		do
		{
			*dest = colormap[translation[source[frac>>FRACBITS]]];
			dest += pitch;

			frac += fracstep;
		} while (--count);
	}
}